

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cc
# Opt level: O0

bool check_type_signature(__cxa_exception *ex,type_info *type,void **adjustedPtr)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  byte local_49;
  type_info *local_48;
  bool is_ptr;
  type_info *ex_type;
  void *exception_ptr;
  void **adjustedPtr_local;
  type_info *type_local;
  __cxa_exception *ex_local;
  
  ex_type = (type_info *)(ex + 1);
  exception_ptr = adjustedPtr;
  adjustedPtr_local = &type->_vptr_type_info;
  type_local = (type_info *)ex;
  if (ex == (__cxa_exception *)0x0) {
    local_48 = (type_info *)0x0;
    local_49 = 0;
  }
  else {
    local_48 = ex->exceptionType;
    iVar2 = (*local_48->_vptr_type_info[2])();
    local_49 = (byte)iVar2;
  }
  if ((local_49 & 1) != 0) {
    ex_type = (type_info *)ex_type->_vptr_type_info;
  }
  if (adjustedPtr_local == (void **)0x0) {
    if (type_local != (type_info *)0x0) {
      *(type_info **)exception_ptr = ex_type;
    }
    ex_local._7_1_ = true;
  }
  else if (type_local == (type_info *)0x0) {
    ex_local._7_1_ = false;
  }
  else {
    bVar1 = std::type_info::operator==((type_info *)adjustedPtr_local,local_48);
    if (bVar1) {
      *(type_info **)exception_ptr = ex_type;
      ex_local._7_1_ = true;
    }
    else {
      uVar3 = (**(code **)((long)*adjustedPtr_local + 0x20))(adjustedPtr_local,local_48,&ex_type,1);
      if ((uVar3 & 1) == 0) {
        ex_local._7_1_ = false;
      }
      else {
        *(type_info **)exception_ptr = ex_type;
        ex_local._7_1_ = true;
      }
    }
  }
  return ex_local._7_1_;
}

Assistant:

static bool check_type_signature(__cxa_exception *ex,
                                 const std::type_info *type,
                                 void *&adjustedPtr)
{
	void *exception_ptr = static_cast<void*>(ex+1);
	const std::type_info *ex_type = ex ? ex->exceptionType : 0;

	bool is_ptr = ex ? ex_type->__is_pointer_p() : false;
	if (is_ptr)
	{
		exception_ptr = *static_cast<void**>(exception_ptr);
	}
	// Always match a catchall, even with a foreign exception
	//
	// Note: A 0 here is a catchall, not a cleanup, so we return true to
	// indicate that we found a catch.
	if (0 == type)
	{
		if (ex)
		{
			adjustedPtr = exception_ptr;
		}
		return true;
	}

	if (0 == ex) { return false; }

	// If the types are the same, no casting is needed.
	if (*type == *ex_type)
	{
		adjustedPtr = exception_ptr;
		return true;
	}


	if (type->__do_catch(ex_type, &exception_ptr, 1))
	{
		adjustedPtr = exception_ptr;
		return true;
	}

	return false;
}